

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynEnumDefinition * ParseEnumDefinition(ParseContext *ctx)

{
  uint uVar1;
  Lexeme *begin;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SynIdentifier *this;
  SynBase *this_00;
  undefined4 extraout_var_02;
  SynConstant *node;
  SynEnumDefinition *this_01;
  Lexeme *pLVar4;
  Lexeme *begin_00;
  char *pcVar5;
  IntrusiveList<SynConstant> values;
  SynIdentifier *local_68;
  IntrusiveList<SynConstant> local_58;
  SynConstant *local_48;
  SynConstant *pSStack_40;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  begin = ctx->currentLexeme;
  if (begin->type == lex_enum) {
    ctx->currentLexeme = begin + 1;
    bVar2 = anon_unknown.dwarf_169315::CheckAt(ctx,lex_string,"ERROR: enum name expected");
    if (bVar2) {
      pLVar4 = ctx->currentLexeme;
      pcVar5 = pLVar4->pos;
      uVar1 = pLVar4->length;
      if (pLVar4->type != lex_none) {
        ctx->currentLexeme = pLVar4 + 1;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_68 = (SynIdentifier *)CONCAT44(extraout_var,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021a1e9;
      pLVar4 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)local_68,4,pLVar4,pLVar4);
      (local_68->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (local_68->name).begin = pcVar5;
      (local_68->name).end = pcVar5 + uVar1;
    }
    else {
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      local_68 = (SynIdentifier *)CONCAT44(extraout_var_00,iVar3);
      (local_68->super_SynBase).typeID = 4;
      (local_68->super_SynBase).begin = (Lexeme *)0x0;
      (local_68->super_SynBase).end = (Lexeme *)0x0;
      (local_68->super_SynBase).pos.begin = (char *)0x0;
      (local_68->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(local_68->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(local_68->super_SynBase).next + 2) = 0;
      (local_68->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (local_68->name).begin = (char *)0x0;
      (local_68->name).end = (char *)0x0;
    }
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_ofigure,"ERROR: \'{\' not found after enum name");
    local_58.head = (SynConstant *)0x0;
    local_58.tail = (SynConstant *)0x0;
    while( true ) {
      if (local_58.head == (SynConstant *)0x0) {
        pcVar5 = "ERROR: enumeration name expected after \'{\'";
      }
      else {
        pcVar5 = "ERROR: enumeration name expected after \',\'";
      }
      bVar2 = anon_unknown.dwarf_169315::CheckAt(ctx,lex_string,pcVar5);
      if (!bVar2) break;
      pLVar4 = ctx->currentLexeme;
      pcVar5 = pLVar4->pos;
      uVar1 = pLVar4->length;
      if (pLVar4->type != lex_none) {
        ctx->currentLexeme = pLVar4 + 1;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      this = (SynIdentifier *)CONCAT44(extraout_var_01,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021a1e9;
      begin_00 = ctx->currentLexeme + -1;
      SynBase::SynBase((SynBase *)this,4,begin_00,begin_00);
      (this->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (this->name).begin = pcVar5;
      (this->name).end = pcVar5 + uVar1;
      if (ctx->currentLexeme->type == lex_set) {
        ctx->currentLexeme = ctx->currentLexeme + 1;
        this_00 = ParseTernaryExpr(ctx);
        if (this_00 == (SynBase *)0x0) {
          anon_unknown.dwarf_169315::Report
                    (ctx,ctx->currentLexeme,"ERROR: expression not found after \'=\'");
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])();
          this_00 = (SynBase *)CONCAT44(extraout_var_02,iVar3);
          if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021a1e9;
          SynBase::SynBase(this_00,0,begin,ctx->currentLexeme + -1);
          this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_003e6d30;
        }
      }
      else {
        this_00 = (SynBase *)0x0;
      }
      iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      node = (SynConstant *)CONCAT44(extraout_var_03,iVar3);
      if (ctx->currentLexeme <= ctx->firstLexeme) goto LAB_0021a1e9;
      SynBase::SynBase((SynBase *)node,0x3a,pLVar4,ctx->currentLexeme + -1);
      (node->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e7c70;
      node->name = this;
      node->value = this_00;
      IntrusiveList<SynConstant>::push_back(&local_58,node);
      if (ctx->currentLexeme->type != lex_comma) break;
      ctx->currentLexeme = ctx->currentLexeme + 1;
    }
    anon_unknown.dwarf_169315::CheckConsume
              (ctx,lex_cfigure,"ERROR: \'}\' not found after enum definition");
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    this_01 = (SynEnumDefinition *)CONCAT44(extraout_var_04,iVar3);
    if (ctx->currentLexeme <= ctx->firstLexeme) {
LAB_0021a1e9:
      __assert_fail("currentLexeme > firstLexeme",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                    ,0x19c,"Lexeme *ParseContext::Previous()");
    }
    local_48 = local_58.head;
    pSStack_40 = local_58.tail;
    SynBase::SynBase((SynBase *)this_01,0x40,begin,ctx->currentLexeme + -1);
    (this_01->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e7ca8;
    this_01->name = local_68;
    (this_01->values).head = local_48;
    (this_01->values).tail = pSStack_40;
  }
  else {
    this_01 = (SynEnumDefinition *)0x0;
  }
  return this_01;
}

Assistant:

SynEnumDefinition* ParseEnumDefinition(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_enum))
	{
		SynIdentifier *nameIdentifier = NULL;

		if(CheckAt(ctx, lex_string, "ERROR: enum name expected"))
		{
			InplaceStr name = ctx.Consume();
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);
		}
		else
		{
			nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr());
		}

		CheckConsume(ctx, lex_ofigure, "ERROR: '{' not found after enum name");

		IntrusiveList<SynConstant> values;

		do
		{
			if(values.empty())
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after '{'"))
					break;
			}
			else
			{
				if(!CheckAt(ctx, lex_string, "ERROR: enumeration name expected after ','"))
					break;
			}

			Lexeme *pos = ctx.currentLexeme;

			InplaceStr name = ctx.Consume();
			SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(ctx.Previous(), ctx.Previous(), name);

			SynBase *value = NULL;

			if(ctx.Consume(lex_set))
			{
				value = ParseTernaryExpr(ctx);

				if(!value)
				{
					Report(ctx, ctx.Current(), "ERROR: expression not found after '='");

					value = new (ctx.get<SynError>()) SynError(start, ctx.Previous());
				}
			}

			values.push_back(new (ctx.get<SynConstant>()) SynConstant(pos, ctx.Previous(), nameIdentifier, value));
		}
		while(ctx.Consume(lex_comma));

		CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after enum definition");

		return new (ctx.get<SynEnumDefinition>()) SynEnumDefinition(start, ctx.Previous(), nameIdentifier, values);
	}

	return NULL;
}